

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O3

bool __thiscall spv::Builder::isValidInitializer(Builder *this,Id resultId)

{
  Op opcode;
  Instruction *pIVar1;
  bool bVar2;
  StorageClass SVar3;
  bool bVar4;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[resultId];
  opcode = pIVar1->opCode;
  bVar2 = isConstantOpCode(this,opcode);
  bVar4 = true;
  if (!bVar2) {
    if (opcode == OpVariable) {
      SVar3 = Module::getStorageClass(&this->module,pIVar1->typeId);
      bVar4 = SVar3 != Function;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool isValidInitializer(Id resultId) const { return isConstant(resultId) || isGlobalVariable(resultId); }